

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  byte bVar1;
  TValue *pTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  IRRef1 IVar6;
  uint uVar7;
  TRef TVar8;
  TRef TVar9;
  TRef TVar10;
  TRef *pTVar11;
  long lVar12;
  IROpT IVar13;
  uint uVar14;
  ulong uVar15;
  int32_t iVar16;
  uint uVar17;
  GCobj *o;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  IRRef1 IVar22;
  ulong uVar23;
  int iVar25;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  uint local_60;
  
  bVar1 = J->pt->numparams;
  uVar15 = (ulong)bVar1;
  lVar19 = (long)(*(int *)((long)J->L->base + -4) >> 3);
  uVar18 = ~uVar15 + lVar19;
  if (0 < J->framedepth) {
    uVar15 = 0;
    if (0 < (long)uVar18) {
      uVar15 = uVar18;
    }
    if (nresults == 1) {
      uVar7 = J->maxslot;
      nresults = 1;
      if (dst < uVar7) goto LAB_00150b83;
      iVar25 = 1;
    }
    else {
      if (nresults == -1) {
        nresults = uVar15;
      }
      iVar25 = (int)nresults;
    }
    uVar7 = iVar25 + dst;
    J->maxslot = uVar7;
LAB_00150b83:
    if (uVar7 + J->baseslot < 0xfa) {
      if (0 < nresults) {
        pTVar11 = J->base;
        uVar23 = 0;
        do {
          TVar8 = 0x7fff;
          if (((long)uVar23 < (long)uVar18) && (TVar8 = pTVar11[~uVar15 + uVar23], TVar8 == 0)) {
            TVar8 = sload(J,(int)uVar23 + (-1 - (int)uVar15));
            pTVar11 = J->base;
          }
          pTVar11[dst + uVar23] = TVar8;
          uVar23 = uVar23 + 1;
        } while (nresults != uVar23);
      }
      return;
    }
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
  (J->fold).ins.field_0.ot = 0x4613;
  (J->fold).ins.field_1.op12 = 0x120000;
  TVar8 = lj_opt_fold(J);
  uVar7 = (uint)bVar1 * 8;
  local_60 = (uint)bVar1 * 8 + 0xb;
  IVar22 = (IRRef1)TVar8;
  if (-1 < nresults) {
    if ((long)uVar18 < 1) {
      TVar8 = lj_ir_kint(J,local_60);
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar22;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      lj_opt_fold(J);
      uVar18 = 0;
    }
    else {
      if (uVar18 < (ulong)nresults) {
        iVar16 = *(int32_t *)((long)J->L->base + -4);
        IVar13 = 0x893;
        uVar23 = uVar18;
      }
      else {
        iVar16 = local_60 + (int)nresults * 8;
        IVar13 = 0x193;
        uVar23 = nresults;
      }
      TVar8 = lj_ir_kint(J,iVar16);
      (J->fold).ins.field_0.ot = IVar13;
      (J->fold).ins.field_0.op1 = IVar22;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2a13;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = IVar22;
      TVar8 = lj_opt_fold(J);
      TVar9 = lj_ir_kint(J,uVar7 | 3);
      (J->fold).ins.field_0.ot = 0x2905;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      TVar8 = lj_opt_fold(J);
      if (nresults != 0) {
        uVar20 = 0;
        do {
          uVar7 = *(uint *)((long)J->L->base + uVar20 * 8 + (uVar15 * 8 + lVar19 * -8 | 4));
          uVar14 = ~uVar7;
          if ((uVar7 & 0xffff8000) == 0xffff0000) {
            uVar14 = 3;
          }
          if (uVar7 < 0xfffeffff) {
            uVar14 = 0xe;
          }
          TVar9 = lj_ir_kint(J,(int32_t)uVar20);
          (J->fold).ins.field_0.ot = 0x3805;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          TVar9 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)uVar14 | 0x4780;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = 0;
          TVar10 = lj_opt_fold(J);
          TVar9 = uVar14 * 0xffffff + 0x7fff;
          if (2 < uVar14) {
            TVar9 = TVar10;
          }
          J->base[dst + uVar20] = TVar9;
          uVar20 = uVar20 + 1;
        } while (uVar23 != uVar20);
      }
    }
    auVar5 = _DAT_0015e720;
    auVar4 = _DAT_0015d640;
    auVar3 = _DAT_0015d630;
    lVar19 = nresults - uVar18;
    if (lVar19 != 0 && (long)uVar18 <= nresults) {
      pTVar11 = J->base;
      uVar15 = (ulong)dst;
      lVar12 = lVar19 + -1;
      auVar24._8_4_ = (int)lVar12;
      auVar24._0_8_ = lVar12;
      auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
      uVar23 = 0;
      auVar24 = auVar24 ^ _DAT_0015d640;
      do {
        auVar26._8_4_ = (int)uVar23;
        auVar26._0_8_ = uVar23;
        auVar26._12_4_ = (int)(uVar23 >> 0x20);
        auVar27 = (auVar26 | auVar3) ^ auVar4;
        iVar25 = auVar24._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar25 && auVar24._0_4_ < auVar27._0_4_ ||
                    iVar25 < auVar27._4_4_) & 1)) {
          pTVar11[uVar18 + uVar15 + uVar23] = 0x7fff;
        }
        if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
            auVar27._12_4_ <= auVar24._12_4_) {
          pTVar11[uVar18 + uVar15 + uVar23 + 1] = 0x7fff;
        }
        auVar26 = (auVar26 | auVar5) ^ auVar4;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar25 && (iVar28 != iVar25 || auVar26._0_4_ <= auVar24._0_4_)) {
          pTVar11[uVar18 + uVar15 + uVar23 + 2] = 0x7fff;
          pTVar11[uVar18 + uVar15 + uVar23 + 3] = 0x7fff;
        }
        uVar23 = uVar23 + 4;
      } while ((lVar19 + 3U & 0xfffffffffffffffc) != uVar23);
    }
    if ((nresults == 1) && (dst < J->maxslot)) {
      return;
    }
    J->maxslot = (int)nresults + dst;
    return;
  }
  if ((J->pc[1] & 0xffff00ff) != 0x2010041) {
LAB_00151438:
    (J->errinfo).u64 = 0x4051c00000000000;
    lj_trace_err_info(J,LJ_TRERR_NYIBC);
  }
  pTVar2 = J->L->base;
  uVar14 = J->pc[1] >> 8 & 0xff;
  uVar23 = (ulong)uVar14;
  if ((*(int *)((long)pTVar2 + uVar23 * 8 + 4) != -9) ||
     (o = (GCobj *)(ulong)pTVar2[uVar23].u32.lo, (o->gch).unused1 != '\x10')) goto LAB_00151438;
  TVar9 = lj_ir_kgc(J,o,IRT_FUNC);
  TVar8 = J->base[uVar23];
  if (TVar8 == 0) {
    TVar8 = sload(J,uVar14);
  }
  (J->fold).ins.field_0.ot = 0x888;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
  lj_opt_fold(J);
  uVar14 = dst - 1;
  TVar8 = J->base[uVar14];
  if (TVar8 == 0) {
    TVar8 = sload(J,uVar14);
  }
  iVar16 = lj_ffrecord_select_mode(J,TVar8,J->L->base + uVar14);
  if (iVar16 < 0) goto LAB_00151438;
  lVar19 = (long)iVar16;
  if (iVar16 == 0) {
    if ((long)uVar18 < lVar19) {
      TVar9 = lj_ir_kint(J,local_60);
      IVar6 = (IRRef1)TVar9;
      TVar9 = lj_ir_kint(J,0);
      goto LAB_001511e8;
    }
LAB_00151213:
    TVar9 = lj_ir_kint(J,(uint)bVar1 * -8 + -0xb);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = IVar22;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    if (uVar15 != 0) {
      TVar10 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x193;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      lj_opt_fold(J);
    }
    TVar10 = lj_ir_kint(J,3);
    (J->fold).ins.field_0.ot = 0x2513;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar9 = lj_opt_fold(J);
    if (iVar16 == 0) goto LAB_001513f8;
    TVar10 = lj_ir_kint(J,-1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar8 = lj_opt_fold(J);
    rec_idx_abc(J,TVar9,TVar8,(uint32_t)uVar18);
  }
  else {
    if (4 < (TVar8 >> 0x18 & 0x1f) - 0xf) {
      if ((TVar8 & 0x1f000000) == 0x4000000) {
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5c8e0000;
        TVar8 = lj_opt_fold(J);
      }
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5993226e;
      TVar8 = lj_opt_fold(J);
    }
    if ((short)(IRRef1)TVar8 < 0) {
      if (lVar19 <= (long)uVar18) goto LAB_00151213;
      TVar9 = lj_ir_kint(J,local_60);
      TVar10 = lj_ir_kint(J,3);
      (J->fold).ins.field_0.ot = 0x2413;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      TVar10 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      TVar9 = lj_opt_fold(J);
      IVar6 = (IRRef1)TVar9;
      TVar9 = 0x7fff;
LAB_001511e8:
      (J->fold).ins.field_0.ot = 0x93;
      (J->fold).ins.field_0.op1 = IVar22;
      (J->fold).ins.field_0.op2 = IVar6;
      lj_opt_fold(J);
    }
    else {
      TVar9 = lj_ir_kint(J,local_60 + iVar16 * 8);
      (J->fold).ins.field_0.ot = (ushort)(lVar19 <= (long)uVar18) << 8 | 0x93;
      (J->fold).ins.field_0.op1 = IVar22;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      lj_opt_fold(J);
      local_60 = uVar7 | 3;
      TVar9 = 0x7fff;
    }
  }
  if ((iVar16 != 0) && (lVar19 - uVar18 == 0 || lVar19 < (long)uVar18)) {
    (J->fold).ins.field_0.ot = 0x2a13;
    (J->fold).ins.field_0.op1 = 0x8000;
    (J->fold).ins.field_0.op2 = IVar22;
    TVar9 = lj_opt_fold(J);
    TVar10 = lj_ir_kint(J,local_60 - 8);
    (J->fold).ins.field_0.ot = 0x2905;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    TVar9 = lj_opt_fold(J);
    uVar7 = *(uint *)((long)J->L->base + (lVar19 - uVar18) * 8 + -0xc);
    uVar17 = 3;
    if ((uVar7 & 0xffff8000) != 0xffff0000) {
      uVar17 = ~uVar7;
    }
    uVar21 = 0xe;
    if (0xfffefffe < uVar7) {
      uVar21 = uVar17;
    }
    (J->fold).ins.field_0.ot = 0x3805;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    TVar8 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = (ushort)uVar21 | 0x4780;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    (J->fold).ins.field_0.op2 = 0;
    TVar8 = lj_opt_fold(J);
    TVar9 = uVar21 * 0xffffff + 0x7fff;
    if (2 < uVar21) {
      TVar9 = TVar8;
    }
  }
LAB_001513f8:
  J->base[dst - 2] = TVar9;
  J->maxslot = uVar14;
  J->bcskip = '\x02';
  return;
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1 - LJ_FR2;
  lj_assertJ(frame_isvarg(J->L->base-1), "VARG in non-vararg frame");
  if (LJ_FR2 && dst > J->maxslot)
    J->base[dst-1] = 0;  /* Prevent resurrection of unrelated slot. */
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults != 1) {
      if (nresults == -1) nresults = nvararg;
      J->maxslot = dst + (BCReg)nresults;
    } else if (dst >= J->maxslot) {
      J->maxslot = dst + 1;
    }
    if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
      lj_trace_err(J, LJ_TRERR_STACKOV);
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1 - LJ_FR2) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), LJ_FR2, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+LJ_FR2+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr,
		 lj_ir_kint(J, (int32_t)frame_ftsz(J->L->base-1)));
	vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase, lj_ir_kint(J, frofs-8*(1+LJ_FR2)));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-LJ_FR2-nvararg]);
	  TRef aref = emitir(IRT(IR_AREF, IRT_PGC),
			     vbase, lj_ir_kint(J, (int32_t)i));
	  TRef tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	  if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
	  J->base[dst+i] = tr;
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (nresults != 1 || dst >= J->maxslot) {
	J->maxslot = dst + (BCReg)nresults;
      }
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = getslot(J, dst-1);
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx)) {
	if (tref_isstr(tridx))
	  tridx = emitir(IRTG(IR_STRTO, IRT_NUM), tridx, 0);
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      }
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase,
		       lj_ir_kint(J, frofs-(8<<LJ_FR2)));
	t = itype2irt(&J->L->base[idx-2-LJ_FR2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_PGC), vbase, tridx);
	tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
      }
      J->base[dst-2-LJ_FR2] = tr;
      J->maxslot = dst-1-LJ_FR2;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
}